

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

void __thiscall
kj::_::Debug::logInternal
          (Debug *this,char *file,int line,LogSeverity severity,char *macroArgs,
          ArrayPtr<kj::String> argValues)

{
  ArrayPtr<kj::String> argValues_00;
  char *pcVar1;
  size_t sVar2;
  ExceptionCallback *pEVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  uint uVar5;
  undefined8 in_R9;
  StringPtr SVar6;
  undefined4 in_stack_ffffffffffffffb0;
  String local_48;
  
  uVar5 = (uint)file;
  pEVar3 = getExceptionCallback();
  sVar4 = strlen((char *)this);
  SVar6.content.size_ = extraout_RDX;
  SVar6.content.ptr = (char *)(sVar4 + 1);
  SVar6 = trimSourceFilename((kj *)this,SVar6);
  argValues_00.size_._0_4_ = in_stack_ffffffffffffffb0;
  argValues_00.ptr = (String *)in_R9;
  argValues_00.size_._4_4_ = uVar5;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,LOG,(char *)0x0,0,(char *)CONCAT44(in_register_0000000c,severity),macroArgs,
             argValues_00);
  (*pEVar3->_vptr_ExceptionCallback[4])
            (pEVar3,(ulong)(uint)line,SVar6.content.ptr,(ulong)uVar5,0,&local_48);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (*(code *)**(undefined8 **)local_48.content.disposer)
              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void Debug::logInternal(const char* file, int line, LogSeverity severity, const char* macroArgs,
                        ArrayPtr<String> argValues) {
  getExceptionCallback().logMessage(severity, trimSourceFilename(file).cStr(), line, 0,
      makeDescriptionImpl(LOG, nullptr, 0, nullptr, macroArgs, argValues));
}